

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

void INT_REVunstall_stone(CMConnection conn,EVstone stone_id)

{
  int condition;
  CMFormat format;
  EVunstall_stone_request request;
  undefined8 local_28;
  
  local_28 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVunstall_stone_req_formats);
  local_28 = CONCAT44(stone_id,condition);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVunstall_stone_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_28);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVunstall_stone(CMConnection conn, EVstone stone_id)
{
    int cond;
    CMFormat f;
    EVunstall_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVunstall_stone_req_formats);
    request.stone_id = stone_id;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVunstall_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}